

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void RD4_SSE2(uint8_t *dst)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [12];
  uint uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 uVar9;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 auVar13 [16];
  undefined4 uVar10;
  undefined5 uVar11;
  undefined6 uVar12;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  
  uVar1 = *(undefined8 *)(dst + -0x21);
  bVar2 = dst[-1];
  bVar3 = dst[0x1f];
  bVar4 = dst[0x3f];
  uVar6 = (uint)bVar2 << 0x18 | (uint)bVar3 << 0x10 | (uint)dst[0x5f] | (uint)bVar4 << 8;
  auVar5._4_8_ = uVar1;
  auVar5._0_4_ = uVar6;
  auVar7._4_4_ = (int)uVar1;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar13[0] = pavgb(bVar3,dst[0x5f]);
  auVar13[1] = pavgb(bVar2,bVar4);
  uVar17 = (undefined1)uVar1;
  auVar13[2] = pavgb(uVar17,bVar3);
  uVar16 = (undefined1)((ulong)uVar1 >> 8);
  auVar13[3] = pavgb(uVar16,bVar2);
  uVar18 = (undefined1)((ulong)uVar1 >> 0x10);
  auVar13[4] = pavgb(uVar18,uVar17);
  uVar19 = (undefined1)((ulong)uVar1 >> 0x18);
  auVar13[5] = pavgb(uVar19,uVar16);
  uVar20 = (undefined1)((ulong)uVar1 >> 0x20);
  auVar13[6] = pavgb(uVar20,uVar18);
  uVar21 = (undefined1)((ulong)uVar1 >> 0x28);
  auVar13[7] = pavgb(uVar21,uVar19);
  uVar22 = (undefined1)((ulong)uVar1 >> 0x30);
  auVar13[8] = pavgb(uVar22,uVar20);
  uVar23 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar13[9] = pavgb(uVar23,uVar21);
  auVar13[10] = pavgb(0,uVar22);
  auVar13[0xb] = pavgb(0,uVar23);
  auVar13[0xc] = pavgb(0,0);
  auVar13[0xd] = pavgb(0,0);
  auVar13[0xe] = pavgb(0,0);
  auVar13[0xf] = pavgb(0,0);
  auVar8._12_4_ = 0;
  auVar8._0_12_ = auVar7 >> 0x10 ^ auVar5;
  auVar8 = psubusb(auVar13,auVar8 & _DAT_00127480);
  uVar9 = pavgb(auVar8[0],bVar4);
  uVar14 = pavgb(auVar8[1],bVar3);
  uVar15 = pavgb(auVar8[2],bVar2);
  uVar17 = pavgb(auVar8[3],uVar17);
  uVar10 = CONCAT13(uVar17,CONCAT12(uVar15,CONCAT11(uVar14,uVar9)));
  uVar9 = pavgb(auVar8[4],uVar16);
  uVar11 = CONCAT14(uVar9,uVar10);
  uVar9 = pavgb(auVar8[5],uVar18);
  uVar12 = CONCAT15(uVar9,uVar11);
  uVar9 = pavgb(auVar8[6],uVar19);
  pavgb(auVar8[7],uVar20);
  pavgb(auVar8[8],uVar21);
  pavgb(auVar8[9],uVar22);
  pavgb(auVar8[10],uVar23);
  pavgb(auVar8[0xb],0);
  pavgb(auVar8[0xc],0);
  pavgb(auVar8[0xd],0);
  pavgb(auVar8[0xe],0);
  pavgb(auVar8[0xf],0);
  *(undefined4 *)(dst + 0x60) = uVar10;
  *(int *)(dst + 0x40) = (int)((uint5)uVar11 >> 8);
  *(int *)(dst + 0x20) = (int)((uint6)uVar12 >> 0x10);
  *(int *)dst = (int)(CONCAT16(uVar9,uVar12) >> 0x18);
  return;
}

Assistant:

static void RD4_SSE2(uint8_t* dst) {   // Down-right
  const __m128i one = _mm_set1_epi8(1);
  const __m128i XABCD = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i ____XABCD = _mm_slli_si128(XABCD, 4);
  const uint32_t I = dst[-1 + 0 * BPS];
  const uint32_t J = dst[-1 + 1 * BPS];
  const uint32_t K = dst[-1 + 2 * BPS];
  const uint32_t L = dst[-1 + 3 * BPS];
  const __m128i LKJI_____ =
      _mm_cvtsi32_si128((int)(L | (K << 8) | (J << 16) | (I << 24)));
  const __m128i LKJIXABCD = _mm_or_si128(LKJI_____, ____XABCD);
  const __m128i KJIXABCD_ = _mm_srli_si128(LKJIXABCD, 1);
  const __m128i JIXABCD__ = _mm_srli_si128(LKJIXABCD, 2);
  const __m128i avg1 = _mm_avg_epu8(JIXABCD__, LKJIXABCD);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(JIXABCD__, LKJIXABCD), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, KJIXABCD_);
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}